

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

bool __thiscall cfd::core::Script::IsPegoutScript(Script *this)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  const_reference pvVar4;
  ScriptOperator *this_00;
  size_type sVar5;
  ulong local_50;
  size_t i;
  ByteData local_30;
  Script *local_18;
  Script *this_local;
  
  local_18 = this;
  sVar3 = ByteData::GetDataSize(&this->script_data_);
  if (1 < sVar3) {
    pvVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
             operator[](&this->script_stack_,0);
    this_00 = ScriptElement::GetOpCode(pvVar4);
    bVar1 = ScriptOperator::operator!=(this_00,(ScriptOperator *)ScriptOperator::OP_RETURN);
    if (!bVar1) {
      pvVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
               operator[](&this->script_stack_,1);
      bVar2 = ScriptElement::IsBinary(pvVar4);
      bVar1 = true;
      if (bVar2) {
        pvVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ::operator[](&this->script_stack_,1);
        ScriptElement::GetBinaryData(&local_30,pvVar4);
        sVar3 = ByteData::GetDataSize(&local_30);
        bVar1 = sVar3 != 0x20;
        ByteData::~ByteData(&local_30);
      }
      if (!bVar1) {
        local_50 = 2;
        while( true ) {
          sVar5 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ::size(&this->script_stack_);
          if (sVar5 <= local_50) {
            return true;
          }
          pvVar4 = ::std::
                   vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                   operator[](&this->script_stack_,local_50);
          bVar1 = ScriptElement::IsBinary(pvVar4);
          if (!bVar1) break;
          local_50 = local_50 + 1;
        }
        return false;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool Script::IsPegoutScript() const {
  if ((script_data_.GetDataSize() < 2) ||
      (script_stack_[0].GetOpCode() != ScriptOperator::OP_RETURN)) {
    return false;
  }

  if (!script_stack_[1].IsBinary() ||
      script_stack_[1].GetBinaryData().GetDataSize() != kByteData256Length) {
    return false;
  }

  for (size_t i = 2; i < script_stack_.size(); ++i) {
    if (!script_stack_[i].IsBinary()) {
      return false;
    }
  }

  return true;
}